

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rich_text.cpp
# Opt level: O1

bool __thiscall
Am_Rich_Text_Data::Calc_Line_Dim
          (Am_Rich_Text_Data *this,Am_Drawonable *inDrawonable,Am_Text_Index inStartIndex,
          unsigned_long inTargetWidth,Am_Text_Length *outCharsOnLine,unsigned_short *outAscent,
          unsigned_short *outDescent)

{
  int iVar1;
  ushort uVar2;
  unsigned_short *inRelIndex;
  ulong uVar3;
  ulong uVar4;
  Am_Text_Style_Run *inStyleRun;
  Am_Text_Style_Run *pAVar5;
  int iVar6;
  long lVar7;
  Am_Rich_Text_Data *this_00;
  Am_Text_Fragment *inStartFrag;
  unsigned_short *puVar8;
  int iVar9;
  Am_Rich_Text_Data *inMaxChars;
  bool bVar10;
  ulong local_88;
  SStyleRunInfo local_78;
  Am_Text_Length *local_58;
  ushort *local_50;
  Am_Text_Style_Run *local_48;
  unsigned_long local_40;
  Am_Drawonable *local_38;
  
  *outCharsOnLine = 0;
  *outAscent = 0;
  *outDescent = 0;
  inStartFrag = this->mHeadFragment;
  inRelIndex = outAscent;
  if (inStartFrag != (Am_Text_Fragment *)0x0) {
    puVar8 = (unsigned_short *)0x0;
    do {
      inRelIndex = (unsigned_short *)(inStartFrag->mStrLen + (long)puVar8);
      if (inStartIndex <= inRelIndex) {
        inRelIndex = (unsigned_short *)(~(ulong)puVar8 + inStartIndex);
        break;
      }
      inStartFrag = inStartFrag->mNext;
      puVar8 = inRelIndex;
    } while (inStartFrag != (Am_Text_Fragment *)0x0);
  }
  inStyleRun = this->mHeadStyle;
  lVar7 = 1;
  if (inStyleRun != (Am_Text_Style_Run *)0x0) {
    uVar3 = 0;
    do {
      uVar4 = inStyleRun->mCharsInRun + uVar3;
      if (inStartIndex <= uVar4) {
        lVar7 = (uVar3 - inStartIndex) + 1;
        break;
      }
      inStyleRun = inStyleRun->mNext;
      uVar3 = uVar4;
    } while (inStyleRun != (Am_Text_Style_Run *)0x0);
  }
  this_00 = (Am_Rich_Text_Data *)(lVar7 + inStyleRun->mCharsInRun);
  local_88 = 0;
  local_58 = outCharsOnLine;
  local_50 = outAscent;
  local_40 = inTargetWidth;
  local_38 = inDrawonable;
  do {
    Find_Next_Break((SBreakInfo *)&local_78,(Am_Text_Index)inRelIndex,inStartFrag);
    iVar1 = (int)local_78.width_used;
    uVar3 = CONCAT44(local_78.descent,local_78.ascent);
    if (uVar3 == 0) {
      uVar4 = 0;
      lVar7 = 0;
      iVar6 = 0;
      iVar9 = 0;
      pAVar5 = inStyleRun;
    }
    else {
      iVar9 = 0;
      iVar6 = 0;
      lVar7 = 0;
      uVar4 = 0;
      local_48 = inStyleRun;
      do {
        inMaxChars = (Am_Rich_Text_Data *)(uVar3 - uVar4);
        if (this_00 <= (Am_Rich_Text_Data *)(uVar3 - uVar4)) {
          inMaxChars = this_00;
        }
        Calc_SR_Dim(&local_78,this_00,local_38,inStyleRun,inStartFrag,(Am_Text_Offset)inRelIndex,
                    (Am_Text_Index)inMaxChars);
        lVar7 = lVar7 + CONCAT44(local_78.width_used._4_4_,(int)local_78.width_used);
        uVar4 = (long)&(inMaxChars->super_Am_Wrapper).super_Am_Registered_Type.
                       _vptr_Am_Registered_Type + uVar4;
        this_00 = (Am_Rich_Text_Data *)((long)this_00 - (long)inMaxChars);
        if (iVar6 < local_78.ascent) {
          iVar6 = local_78.ascent;
        }
        if (iVar9 < local_78.descent) {
          iVar9 = local_78.descent;
        }
        pAVar5 = local_48;
        inStartFrag = local_78.end_frag;
        inRelIndex = (unsigned_short *)local_78.end_frag_offset;
        if (iVar1 == 2) break;
        if (this_00 == (Am_Rich_Text_Data *)0x0) {
          inStyleRun = inStyleRun->mNext;
          if (inStyleRun == (Am_Text_Style_Run *)0x0) {
            Am_Error("Ran out of Style_Run info.");
          }
          this_00 = (Am_Rich_Text_Data *)inStyleRun->mCharsInRun;
        }
        pAVar5 = inStyleRun;
      } while (uVar4 < uVar3);
    }
    if (local_40 < lVar7 + local_88) {
      bVar10 = false;
    }
    else {
      *local_58 = *local_58 + uVar4;
      uVar2 = *local_50;
      if ((int)(uint)uVar2 < iVar6) {
        uVar2 = (ushort)iVar6;
      }
      *local_50 = uVar2;
      uVar2 = *outDescent;
      if ((int)(uint)uVar2 < iVar9) {
        uVar2 = (ushort)iVar9;
      }
      *outDescent = uVar2;
      bVar10 = iVar1 != 2;
      local_88 = lVar7 + local_88;
    }
    inStyleRun = pAVar5;
    if (!bVar10) {
      return iVar1 == 2;
    }
  } while( true );
}

Assistant:

bool
Am_Rich_Text_Data::Calc_Line_Dim(Am_Drawonable *inDrawonable,
                                 Am_Text_Index inStartIndex,
                                 unsigned long inTargetWidth,
                                 Am_Text_Length &outCharsOnLine,
                                 unsigned short &outAscent,
                                 unsigned short &outDescent)
{
  unsigned long cumChars = 0, cumWidth = 0;
  Am_Text_Index relSRIndex = 0, chars_rem_in_sr = 0;
  SBreakInfo break_info;
  SStyleRunInfo sr_info;

  outCharsOnLine = 0;
  outAscent = 0;
  outDescent = 0;

  sr_info.end_frag = Get_Fragment_At(inStartIndex, sr_info.end_frag_offset);
  Am_Text_Style_Run *curSR = Get_Style_Run_At(inStartIndex, relSRIndex);

  chars_rem_in_sr = curSR->Length() - relSRIndex + 1; // incl cur char too

  // COMMENT .....
  while (true) {
    break_info = Find_Next_Break(sr_info.end_frag_offset, sr_info.end_frag);

    // this loop calculates how many pixels are needed to print until
    // the next break. There may be more than one style run until that break

    Am_Text_Length break_chars_used = 0, max_chars = 0;
    unsigned long break_width_used = 0;
    int break_ascent = 0, break_descent = 0;

    // Continue stepping through the style runs, until having processed
    // break_info.len characters or used up more pixels than were remaining
    while (break_chars_used < break_info.len) {
      max_chars = min(break_info.len - break_chars_used, chars_rem_in_sr);

      sr_info = Calc_SR_Dim(inDrawonable, curSR, sr_info.end_frag,
                            sr_info.end_frag_offset, max_chars);

      // Update data about this break
      break_width_used += sr_info.width_used;
      break_chars_used += max_chars;
      chars_rem_in_sr -= max_chars;

      break_ascent = max(sr_info.ascent, break_ascent);
      break_descent = max(sr_info.descent, break_descent);

      if (break_info.why == EndOfText)
        break;

      // skip to next style run, since there should be more test remaining
      if (chars_rem_in_sr == 0) {
        curSR = curSR->Next();
        if (curSR == nullptr) {
          Am_Error("Ran out of Style_Run info.");
          // this should never happen... eventually throw an exception
        }
        chars_rem_in_sr = curSR->Length();
      }
    }

    if (cumWidth + break_width_used <= inTargetWidth) {
      outCharsOnLine += break_chars_used;

      outAscent = max(break_ascent, outAscent);
      outDescent = max(break_descent, outDescent);
      cumChars += break_chars_used;
      cumWidth += break_width_used;
    } else
      break;

    if (break_info.why == EndOfText)
      break;
  }

  return (break_info.why == EndOfText) ? true : false;
}